

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_trace_striped_sse2_128_16.c
# Opt level: O1

parasail_result_t *
parasail_nw_trace_striped_profile_sse2_128_16
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  ulong uVar1;
  undefined8 *puVar2;
  ushort *puVar3;
  short *psVar4;
  ushort *puVar5;
  undefined1 auVar6 [16];
  void *pvVar7;
  parasail_matrix_t *ppVar8;
  int *piVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  short sVar20;
  short sVar21;
  short sVar22;
  short sVar23;
  short sVar24;
  short sVar25;
  short sVar26;
  short sVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined4 uVar35;
  undefined4 uVar36;
  undefined4 uVar37;
  uint uVar38;
  int iVar39;
  int iVar40;
  int iVar41;
  int iVar42;
  int iVar43;
  parasail_result_t *ppVar44;
  __m128i *palVar45;
  __m128i *ptr;
  __m128i *ptr_00;
  __m128i *palVar46;
  __m128i *ptr_01;
  __m128i *ptr_02;
  int16_t *ptr_03;
  ulong uVar47;
  undefined2 uVar48;
  int16_t iVar49;
  uint uVar50;
  long lVar51;
  int iVar52;
  int iVar53;
  long lVar54;
  ulong uVar55;
  ulong uVar56;
  long lVar57;
  long lVar58;
  ulong uVar59;
  long lVar60;
  int a;
  ulong uVar61;
  bool bVar62;
  ushort uVar63;
  undefined4 uVar64;
  undefined4 uVar65;
  undefined4 uVar66;
  ulong uVar67;
  ushort uVar72;
  ushort uVar74;
  ushort uVar76;
  ushort uVar78;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  ushort uVar71;
  ushort uVar73;
  ushort uVar80;
  undefined1 auVar70 [16];
  ushort uVar84;
  ushort uVar85;
  ushort uVar86;
  undefined1 auVar82 [16];
  ushort uVar87;
  undefined1 auVar83 [16];
  ushort uVar88;
  ushort uVar90;
  ushort uVar91;
  ushort uVar92;
  ushort uVar93;
  ushort uVar94;
  ushort uVar95;
  ushort uVar96;
  undefined1 auVar89 [16];
  short sVar97;
  ushort uVar98;
  short sVar99;
  short sVar100;
  short sVar101;
  ushort uVar102;
  short sVar103;
  short sVar104;
  short sVar105;
  ushort uVar106;
  short sVar107;
  short sVar108;
  ushort uVar109;
  short sVar110;
  undefined1 auVar111 [16];
  ushort uVar112;
  short sVar113;
  short sVar114;
  ushort uVar117;
  short sVar118;
  ushort uVar120;
  short sVar121;
  ushort uVar123;
  short sVar124;
  short sVar125;
  short sVar127;
  short sVar129;
  short sVar131;
  undefined1 auVar115 [16];
  short sVar119;
  short sVar122;
  short sVar126;
  short sVar128;
  short sVar130;
  undefined1 auVar116 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  __m128i_16_t e;
  __m128i_16_t h;
  long local_110;
  ushort local_104;
  __m128i *local_100;
  __m128i *local_d0;
  ushort local_88;
  ushort uStack_86;
  longlong local_58;
  longlong lStack_50;
  longlong local_48;
  longlong lStack_40;
  ushort uVar75;
  ushort uVar77;
  ushort uVar79;
  ushort uVar81;
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_nw_trace_striped_profile_sse2_128_16_cold_8();
  }
  else {
    pvVar7 = (profile->profile16).score;
    if (pvVar7 == (void *)0x0) {
      parasail_nw_trace_striped_profile_sse2_128_16_cold_7();
    }
    else {
      ppVar8 = profile->matrix;
      if (ppVar8 == (parasail_matrix_t *)0x0) {
        parasail_nw_trace_striped_profile_sse2_128_16_cold_6();
      }
      else {
        uVar50 = profile->s1Len;
        if ((int)uVar50 < 1) {
          parasail_nw_trace_striped_profile_sse2_128_16_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_nw_trace_striped_profile_sse2_128_16_cold_4();
        }
        else {
          uVar59 = (ulong)(uint)s2Len;
          if (s2Len < 1) {
            parasail_nw_trace_striped_profile_sse2_128_16_cold_3();
          }
          else if (open < 0) {
            parasail_nw_trace_striped_profile_sse2_128_16_cold_2();
          }
          else if (gap < 0) {
            parasail_nw_trace_striped_profile_sse2_128_16_cold_1();
          }
          else {
            iVar40 = uVar50 - 1;
            uVar61 = (ulong)uVar50 + 7 >> 3;
            a = (int)uVar61;
            iVar52 = -open;
            iVar43 = ppVar8->min;
            iVar53 = -iVar43;
            if (iVar43 != iVar52 && SBORROW4(iVar43,iVar52) == iVar43 + open < 0) {
              iVar53 = open;
            }
            iVar39 = ppVar8->max;
            ppVar44 = parasail_result_new_trace(a,s2Len,0x10,0x10);
            if (ppVar44 != (parasail_result_t *)0x0) {
              ppVar44->flag = ppVar44->flag | 0x8280801;
              palVar45 = parasail_memalign___m128i(0x10,uVar61);
              ptr = parasail_memalign___m128i(0x10,uVar61);
              ptr_00 = parasail_memalign___m128i(0x10,uVar61);
              palVar46 = parasail_memalign___m128i(0x10,uVar61);
              ptr_01 = parasail_memalign___m128i(0x10,uVar61);
              ptr_02 = parasail_memalign___m128i(0x10,uVar61);
              ptr_03 = parasail_memalign_int16_t(0x10,(ulong)(s2Len + 1));
              if ((ptr_03 != (int16_t *)0x0 &&
                  (ptr_02 != (__m128i *)0x0 && ptr_01 != (__m128i *)0x0)) &&
                  ((palVar46 != (__m128i *)0x0 && ptr_00 != (__m128i *)0x0) &&
                  (ptr != (__m128i *)0x0 && palVar45 != (__m128i *)0x0))) {
                iVar41 = s2Len + -1;
                iVar42 = 7 - iVar40 / a;
                auVar68 = pshuflw(ZEXT416((uint)open),ZEXT416((uint)open),0);
                uVar64 = auVar68._0_4_;
                auVar68 = pshuflw(ZEXT416((uint)gap),ZEXT416((uint)gap),0);
                uVar65 = auVar68._0_4_;
                uVar50 = iVar53 - 0x7fff;
                auVar68 = pshuflw(ZEXT416(uVar50),ZEXT416(uVar50),0);
                local_88 = auVar68._0_2_;
                uStack_86 = auVar68._2_2_;
                auVar69 = ZEXT416(CONCAT22((short)((uint)iVar43 >> 0x10),0x7ffe - (short)iVar39));
                auVar69 = pshuflw(auVar69,auVar69,0);
                uVar66 = auVar69._0_4_;
                sVar100 = auVar69._0_2_;
                sVar103 = auVar69._2_2_;
                lVar54 = (long)iVar52;
                uVar55 = 0;
                do {
                  lVar60 = 0;
                  lVar58 = lVar54;
                  do {
                    uVar48 = 0x8000;
                    if (-0x8000 < lVar58) {
                      uVar48 = (undefined2)lVar58;
                    }
                    *(undefined2 *)((long)&local_48 + lVar60 * 2) = uVar48;
                    lVar51 = lVar58 - (ulong)(uint)open;
                    if (lVar51 < -0x7fff) {
                      lVar51 = -0x8000;
                    }
                    *(short *)((long)&local_58 + lVar60 * 2) = (short)lVar51;
                    lVar60 = lVar60 + 1;
                    lVar58 = lVar58 - uVar61 * (uint)gap;
                  } while (lVar60 != 8);
                  palVar45[uVar55][0] = local_48;
                  palVar45[uVar55][1] = lStack_40;
                  ptr_00[uVar55][0] = local_58;
                  ptr_00[uVar55][1] = lStack_50;
                  palVar46[uVar55][0] = local_58;
                  palVar46[uVar55][1] = lStack_50;
                  uVar55 = uVar55 + 1;
                  lVar54 = lVar54 - (ulong)(uint)gap;
                } while (uVar55 != uVar61);
                *ptr_03 = 0;
                uVar55 = 1;
                do {
                  iVar49 = -0x8000;
                  if (-0x8000 < iVar52) {
                    iVar49 = (int16_t)iVar52;
                  }
                  ptr_03[uVar55] = iVar49;
                  uVar55 = uVar55 + 1;
                  iVar52 = iVar52 - gap;
                } while (s2Len + 1 != uVar55);
                lVar58 = (ulong)(a + (uint)(a == 0)) << 4;
                lVar54 = 0;
                do {
                  puVar2 = (undefined8 *)((long)((ppVar44->field_4).rowcols)->score_row + lVar54);
                  *puVar2 = 0x8000800080008;
                  puVar2[1] = 0x8000800080008;
                  lVar54 = lVar54 + 0x10;
                } while (lVar58 != lVar54);
                uVar55 = 1;
                if (1 < s2Len) {
                  uVar55 = uVar59;
                }
                lVar60 = uVar61 * 0x10;
                lVar54 = 0;
                uVar56 = 0;
                uVar35 = uVar66;
                uVar36 = uVar66;
                uVar37 = uVar66;
                uVar88 = local_88;
                uVar90 = uStack_86;
                uVar91 = local_88;
                uVar92 = uStack_86;
                uVar93 = local_88;
                uVar94 = uStack_86;
                uVar95 = local_88;
                uVar96 = uStack_86;
                local_110 = lVar60;
                do {
                  local_d0 = ptr_01;
                  local_100 = ptr;
                  ptr = palVar45;
                  ptr_01 = palVar46;
                  uVar1 = ptr[a - 1U][0];
                  auVar69._8_8_ = ptr[a - 1U][1] << 0x10 | uVar1 >> 0x30;
                  auVar69._0_8_ = uVar1 << 0x10 | (ulong)(ushort)ptr_03[uVar56];
                  lVar51 = uVar61 * (long)ppVar8->mapper[(byte)s2[uVar56]];
                  uVar1 = uVar56 + 1;
                  uVar47 = 1;
                  lVar57 = 0;
                  auVar83._4_2_ = local_88;
                  auVar83._0_4_ = auVar68._0_4_;
                  auVar83._6_2_ = uStack_86;
                  auVar83._8_2_ = local_88;
                  auVar83._10_2_ = uStack_86;
                  auVar83._12_2_ = local_88;
                  auVar83._14_2_ = uStack_86;
                  do {
                    sVar110 = (short)((uint)uVar37 >> 0x10);
                    sVar108 = (short)uVar37;
                    sVar107 = (short)((uint)uVar36 >> 0x10);
                    sVar105 = (short)uVar36;
                    sVar104 = (short)((uint)uVar35 >> 0x10);
                    sVar101 = (short)uVar35;
                    sVar99 = (short)((uint)uVar66 >> 0x10);
                    sVar97 = (short)uVar66;
                    auVar6 = *(undefined1 (*) [16])((long)*ptr_00 + lVar57);
                    auVar69 = paddsw(auVar69,*(undefined1 (*) [16])
                                              ((long)pvVar7 + lVar57 + lVar51 * 0x10));
                    sVar10 = auVar6._0_2_;
                    uVar98 = auVar69._0_2_;
                    uVar63 = (ushort)((short)uVar98 < sVar10) * sVar10 |
                             ((short)uVar98 >= sVar10) * uVar98;
                    sVar13 = auVar6._2_2_;
                    uVar102 = auVar69._2_2_;
                    uVar71 = (ushort)((short)uVar102 < sVar13) * sVar13 |
                             ((short)uVar102 >= sVar13) * uVar102;
                    sVar114 = auVar6._4_2_;
                    uVar106 = auVar69._4_2_;
                    uVar72 = (ushort)((short)uVar106 < sVar114) * sVar114 |
                             ((short)uVar106 >= sVar114) * uVar106;
                    sVar126 = auVar6._6_2_;
                    uVar109 = auVar69._6_2_;
                    uVar73 = (ushort)((short)uVar109 < sVar126) * sVar126 |
                             ((short)uVar109 >= sVar126) * uVar109;
                    sVar16 = auVar6._8_2_;
                    uVar75 = auVar69._8_2_;
                    uVar74 = (ushort)((short)uVar75 < sVar16) * sVar16 |
                             ((short)uVar75 >= sVar16) * uVar75;
                    sVar19 = auVar6._10_2_;
                    uVar77 = auVar69._10_2_;
                    uVar76 = (ushort)((short)uVar77 < sVar19) * sVar19 |
                             ((short)uVar77 >= sVar19) * uVar77;
                    sVar22 = auVar6._12_2_;
                    uVar79 = auVar69._12_2_;
                    uVar81 = auVar69._14_2_;
                    uVar78 = (ushort)((short)uVar79 < sVar22) * sVar22 |
                             ((short)uVar79 >= sVar22) * uVar79;
                    sVar25 = auVar6._14_2_;
                    uVar80 = (ushort)((short)uVar81 < sVar25) * sVar25 |
                             ((short)uVar81 >= sVar25) * uVar81;
                    sVar11 = auVar83._0_2_;
                    auVar111._0_2_ =
                         (ushort)((short)uVar63 < sVar11) * sVar11 |
                         ((short)uVar63 >= sVar11) * uVar63;
                    sVar14 = auVar83._2_2_;
                    auVar111._2_2_ =
                         (ushort)((short)uVar71 < sVar14) * sVar14 |
                         ((short)uVar71 >= sVar14) * uVar71;
                    sVar119 = auVar83._4_2_;
                    auVar111._4_2_ =
                         (ushort)((short)uVar72 < sVar119) * sVar119 |
                         ((short)uVar72 >= sVar119) * uVar72;
                    sVar128 = auVar83._6_2_;
                    auVar111._6_2_ =
                         (ushort)((short)uVar73 < sVar128) * sVar128 |
                         ((short)uVar73 >= sVar128) * uVar73;
                    sVar17 = auVar83._8_2_;
                    auVar111._8_2_ =
                         (ushort)((short)uVar74 < sVar17) * sVar17 |
                         ((short)uVar74 >= sVar17) * uVar74;
                    sVar20 = auVar83._10_2_;
                    auVar111._10_2_ =
                         (ushort)((short)uVar76 < sVar20) * sVar20 |
                         ((short)uVar76 >= sVar20) * uVar76;
                    sVar23 = auVar83._12_2_;
                    auVar111._12_2_ =
                         (ushort)((short)uVar78 < sVar23) * sVar23 |
                         ((short)uVar78 >= sVar23) * uVar78;
                    sVar26 = auVar83._14_2_;
                    auVar111._14_2_ =
                         (ushort)((short)uVar80 < sVar26) * sVar26 |
                         ((short)uVar80 >= sVar26) * uVar80;
                    *(undefined1 (*) [16])((long)*local_100 + lVar57) = auVar111;
                    uVar112 = -(ushort)(uVar98 == auVar111._0_2_) & 4 |
                              ~-(ushort)(uVar98 == auVar111._0_2_) & 2 - (sVar11 < (short)uVar63);
                    uVar117 = -(ushort)(uVar102 == auVar111._2_2_) & 4 |
                              ~-(ushort)(uVar102 == auVar111._2_2_) & 2 - (sVar14 < (short)uVar71);
                    uVar120 = -(ushort)(uVar106 == auVar111._4_2_) & 4 |
                              ~-(ushort)(uVar106 == auVar111._4_2_) & 2 - (sVar119 < (short)uVar72);
                    uVar123 = -(ushort)(uVar109 == auVar111._6_2_) & 4 |
                              ~-(ushort)(uVar109 == auVar111._6_2_) & 2 - (sVar128 < (short)uVar73);
                    uVar75 = -(ushort)(uVar75 == auVar111._8_2_) & 4 |
                             ~-(ushort)(uVar75 == auVar111._8_2_) & 2 - (sVar17 < (short)uVar74);
                    uVar74 = -(ushort)(uVar77 == auVar111._10_2_) & 4 |
                             ~-(ushort)(uVar77 == auVar111._10_2_) & 2 - (sVar20 < (short)uVar76);
                    uVar76 = -(ushort)(uVar79 == auVar111._12_2_) & 4 |
                             ~-(ushort)(uVar79 == auVar111._12_2_) & 2 - (sVar23 < (short)uVar78);
                    uVar77 = -(ushort)(uVar81 == auVar111._14_2_) & 4 |
                             ~-(ushort)(uVar81 == auVar111._14_2_) & 2 - (sVar26 < (short)uVar80);
                    puVar3 = (ushort *)
                             ((long)((ppVar44->field_4).rowcols)->score_row + lVar57 + lVar54);
                    uVar98 = *puVar3;
                    uVar63 = puVar3[1];
                    uVar102 = puVar3[2];
                    uVar71 = puVar3[3];
                    uVar106 = puVar3[4];
                    uVar72 = puVar3[5];
                    uVar109 = puVar3[6];
                    uVar73 = puVar3[7];
                    puVar3 = (ushort *)((long)*ptr_02 + lVar57);
                    *puVar3 = uVar112;
                    puVar3[1] = uVar117;
                    puVar3[2] = uVar120;
                    puVar3[3] = uVar123;
                    puVar3[4] = uVar75;
                    puVar3[5] = uVar74;
                    puVar3[6] = uVar76;
                    puVar3[7] = uVar77;
                    puVar3 = (ushort *)
                             ((long)((ppVar44->field_4).rowcols)->score_row + lVar57 + lVar54);
                    *puVar3 = uVar98 | uVar112;
                    puVar3[1] = uVar63 | uVar117;
                    puVar3[2] = uVar102 | uVar120;
                    puVar3[3] = uVar71 | uVar123;
                    puVar3[4] = uVar106 | uVar75;
                    puVar3[5] = uVar72 | uVar74;
                    puVar3[6] = uVar109 | uVar76;
                    puVar3[7] = uVar73 | uVar77;
                    auVar28._4_4_ = uVar64;
                    auVar28._0_4_ = uVar64;
                    auVar28._8_4_ = uVar64;
                    auVar28._12_4_ = uVar64;
                    auVar70 = psubsw(auVar111,auVar28);
                    auVar30._4_4_ = uVar65;
                    auVar30._0_4_ = uVar65;
                    auVar30._8_4_ = uVar65;
                    auVar30._12_4_ = uVar65;
                    auVar69 = psubsw(auVar6,auVar30);
                    sVar12 = auVar70._0_2_;
                    sVar113 = auVar69._0_2_;
                    sVar15 = auVar70._2_2_;
                    sVar118 = auVar69._2_2_;
                    sVar122 = auVar70._4_2_;
                    sVar121 = auVar69._4_2_;
                    sVar130 = auVar70._6_2_;
                    sVar124 = auVar69._6_2_;
                    sVar18 = auVar70._8_2_;
                    sVar125 = auVar69._8_2_;
                    sVar21 = auVar70._10_2_;
                    sVar127 = auVar69._10_2_;
                    sVar24 = auVar70._12_2_;
                    sVar129 = auVar69._12_2_;
                    sVar131 = auVar69._14_2_;
                    sVar27 = auVar70._14_2_;
                    puVar3 = (ushort *)((long)*ptr_00 + lVar57);
                    *puVar3 = (ushort)(sVar113 < sVar12) * sVar12 |
                              (ushort)(sVar113 >= sVar12) * sVar113;
                    puVar3[1] = (ushort)(sVar118 < sVar15) * sVar15 |
                                (ushort)(sVar118 >= sVar15) * sVar118;
                    puVar3[2] = (ushort)(sVar121 < sVar122) * sVar122 |
                                (ushort)(sVar121 >= sVar122) * sVar121;
                    puVar3[3] = (ushort)(sVar124 < sVar130) * sVar130 |
                                (ushort)(sVar124 >= sVar130) * sVar124;
                    puVar3[4] = (ushort)(sVar125 < sVar18) * sVar18 |
                                (ushort)(sVar125 >= sVar18) * sVar125;
                    puVar3[5] = (ushort)(sVar127 < sVar21) * sVar21 |
                                (ushort)(sVar127 >= sVar21) * sVar127;
                    puVar3[6] = (ushort)(sVar129 < sVar24) * sVar24 |
                                (ushort)(sVar129 >= sVar24) * sVar129;
                    puVar3[7] = (ushort)(sVar131 < sVar27) * sVar27 |
                                (ushort)(sVar131 >= sVar27) * sVar131;
                    auVar6._4_4_ = uVar65;
                    auVar6._0_4_ = uVar65;
                    auVar6._8_4_ = uVar65;
                    auVar6._12_4_ = uVar65;
                    auVar69 = psubsw(*(undefined1 (*) [16])((long)*ptr_01 + lVar57),auVar6);
                    sVar113 = auVar69._0_2_;
                    sVar118 = auVar69._2_2_;
                    sVar121 = auVar69._4_2_;
                    sVar124 = auVar69._6_2_;
                    sVar125 = auVar69._8_2_;
                    sVar127 = auVar69._10_2_;
                    sVar129 = auVar69._12_2_;
                    sVar131 = auVar69._14_2_;
                    puVar3 = (ushort *)((long)*local_d0 + lVar57);
                    *puVar3 = (ushort)(sVar12 < sVar113) * sVar113 |
                              (ushort)(sVar12 >= sVar113) * sVar12;
                    puVar3[1] = (ushort)(sVar15 < sVar118) * sVar118 |
                                (ushort)(sVar15 >= sVar118) * sVar15;
                    puVar3[2] = (ushort)(sVar122 < sVar121) * sVar121 |
                                (ushort)(sVar122 >= sVar121) * sVar122;
                    puVar3[3] = (ushort)(sVar130 < sVar124) * sVar124 |
                                (ushort)(sVar130 >= sVar124) * sVar130;
                    puVar3[4] = (ushort)(sVar18 < sVar125) * sVar125 |
                                (ushort)(sVar18 >= sVar125) * sVar18;
                    puVar3[5] = (ushort)(sVar21 < sVar127) * sVar127 |
                                (ushort)(sVar21 >= sVar127) * sVar21;
                    puVar3[6] = (ushort)(sVar24 < sVar129) * sVar129 |
                                (ushort)(sVar24 >= sVar129) * sVar24;
                    puVar3[7] = (ushort)(sVar27 < sVar131) * sVar131 |
                                (ushort)(sVar27 >= sVar131) * sVar27;
                    if (uVar1 < uVar59) {
                      puVar3 = (ushort *)
                               ((long)((ppVar44->field_4).rowcols)->score_row + lVar57 + local_110);
                      *puVar3 = -(ushort)(sVar113 < sVar12) & 0x18 ^ 0x10;
                      puVar3[1] = -(ushort)(sVar118 < sVar15) & 0x18 ^ 0x10;
                      puVar3[2] = -(ushort)(sVar121 < sVar122) & 0x18 ^ 0x10;
                      puVar3[3] = -(ushort)(sVar124 < sVar130) & 0x18 ^ 0x10;
                      puVar3[4] = -(ushort)(sVar125 < sVar18) & 0x18 ^ 0x10;
                      puVar3[5] = -(ushort)(sVar127 < sVar21) & 0x18 ^ 0x10;
                      puVar3[6] = -(ushort)(sVar129 < sVar24) & 0x18 ^ 0x10;
                      puVar3[7] = -(ushort)(sVar131 < sVar27) & 0x18 ^ 0x10;
                    }
                    auVar31._4_4_ = uVar65;
                    auVar31._0_4_ = uVar65;
                    auVar31._8_4_ = uVar65;
                    auVar31._12_4_ = uVar65;
                    auVar133 = psubsw(auVar83,auVar31);
                    sVar113 = auVar133._0_2_;
                    sVar118 = auVar133._2_2_;
                    sVar121 = auVar133._4_2_;
                    sVar124 = auVar133._6_2_;
                    sVar125 = auVar133._8_2_;
                    sVar127 = auVar133._10_2_;
                    sVar129 = auVar133._12_2_;
                    sVar131 = auVar133._14_2_;
                    if (uVar47 < uVar61) {
                      piVar9 = ((ppVar44->field_4).rowcols)->score_row;
                      puVar3 = (ushort *)((long)piVar9 + lVar57 + 0x10 + lVar54);
                      uVar98 = puVar3[1];
                      uVar63 = puVar3[2];
                      uVar102 = puVar3[3];
                      uVar71 = puVar3[4];
                      uVar106 = puVar3[5];
                      uVar72 = puVar3[6];
                      uVar109 = puVar3[7];
                      puVar5 = (ushort *)((long)piVar9 + lVar57 + 0x10 + lVar54);
                      *puVar5 = -(ushort)(sVar113 < sVar12) & 0x60 ^ 0x40 | *puVar3;
                      puVar5[1] = -(ushort)(sVar118 < sVar15) & 0x60 ^ 0x40 | uVar98;
                      puVar5[2] = -(ushort)(sVar121 < sVar122) & 0x60 ^ 0x40 | uVar63;
                      puVar5[3] = -(ushort)(sVar124 < sVar130) & 0x60 ^ 0x40 | uVar102;
                      puVar5[4] = -(ushort)(sVar125 < sVar18) & 0x60 ^ 0x40 | uVar71;
                      puVar5[5] = -(ushort)(sVar127 < sVar21) & 0x60 ^ 0x40 | uVar106;
                      puVar5[6] = -(ushort)(sVar129 < sVar24) & 0x60 ^ 0x40 | uVar72;
                      puVar5[7] = -(ushort)(sVar131 < sVar27) & 0x60 ^ 0x40 | uVar109;
                    }
                    uVar88 = ((short)uVar88 < (short)auVar111._0_2_) * auVar111._0_2_ |
                             ((short)uVar88 >= (short)auVar111._0_2_) * uVar88;
                    uVar90 = ((short)uVar90 < (short)auVar111._2_2_) * auVar111._2_2_ |
                             ((short)uVar90 >= (short)auVar111._2_2_) * uVar90;
                    uVar91 = ((short)uVar91 < (short)auVar111._4_2_) * auVar111._4_2_ |
                             ((short)uVar91 >= (short)auVar111._4_2_) * uVar91;
                    uVar92 = ((short)uVar92 < (short)auVar111._6_2_) * auVar111._6_2_ |
                             ((short)uVar92 >= (short)auVar111._6_2_) * uVar92;
                    uVar93 = ((short)uVar93 < (short)auVar111._8_2_) * auVar111._8_2_ |
                             ((short)uVar93 >= (short)auVar111._8_2_) * uVar93;
                    uVar94 = ((short)uVar94 < (short)auVar111._10_2_) * auVar111._10_2_ |
                             ((short)uVar94 >= (short)auVar111._10_2_) * uVar94;
                    uVar95 = ((short)uVar95 < (short)auVar111._12_2_) * auVar111._12_2_ |
                             ((short)uVar95 >= (short)auVar111._12_2_) * uVar95;
                    uVar96 = ((short)uVar96 < (short)auVar111._14_2_) * auVar111._14_2_ |
                             ((short)uVar96 >= (short)auVar111._14_2_) * uVar96;
                    uVar98 = (ushort)(sVar10 < sVar97) * sVar10 |
                             (ushort)(sVar10 >= sVar97) * sVar97;
                    uVar63 = (ushort)(sVar13 < sVar99) * sVar13 |
                             (ushort)(sVar13 >= sVar99) * sVar99;
                    uVar102 = (ushort)(sVar114 < sVar101) * sVar114 |
                              (ushort)(sVar114 >= sVar101) * sVar101;
                    uVar71 = (ushort)(sVar126 < sVar104) * sVar126 |
                             (ushort)(sVar126 >= sVar104) * sVar104;
                    uVar106 = (ushort)(sVar16 < sVar105) * sVar16 |
                              (ushort)(sVar16 >= sVar105) * sVar105;
                    uVar72 = (ushort)(sVar19 < sVar107) * sVar19 |
                             (ushort)(sVar19 >= sVar107) * sVar107;
                    uVar109 = (ushort)(sVar22 < sVar108) * sVar22 |
                              (ushort)(sVar22 >= sVar108) * sVar108;
                    uVar73 = (ushort)(sVar25 < sVar110) * sVar25 |
                             (ushort)(sVar25 >= sVar110) * sVar110;
                    uVar98 = (ushort)(sVar11 < (short)uVar98) * sVar11 |
                             (sVar11 >= (short)uVar98) * uVar98;
                    uVar63 = (ushort)(sVar14 < (short)uVar63) * sVar14 |
                             (sVar14 >= (short)uVar63) * uVar63;
                    uVar102 = (ushort)(sVar119 < (short)uVar102) * sVar119 |
                              (sVar119 >= (short)uVar102) * uVar102;
                    uVar71 = (ushort)(sVar128 < (short)uVar71) * sVar128 |
                             (sVar128 >= (short)uVar71) * uVar71;
                    uVar106 = (ushort)(sVar17 < (short)uVar106) * sVar17 |
                              (sVar17 >= (short)uVar106) * uVar106;
                    uVar72 = (ushort)(sVar20 < (short)uVar72) * sVar20 |
                             (sVar20 >= (short)uVar72) * uVar72;
                    uVar109 = (ushort)(sVar23 < (short)uVar109) * sVar23 |
                              (sVar23 >= (short)uVar109) * uVar109;
                    uVar73 = (ushort)(sVar26 < (short)uVar73) * sVar26 |
                             (sVar26 >= (short)uVar73) * uVar73;
                    uVar98 = ((short)auVar111._0_2_ < (short)uVar98) * auVar111._0_2_ |
                             ((short)auVar111._0_2_ >= (short)uVar98) * uVar98;
                    uVar63 = ((short)auVar111._2_2_ < (short)uVar63) * auVar111._2_2_ |
                             ((short)auVar111._2_2_ >= (short)uVar63) * uVar63;
                    uVar66 = CONCAT22(uVar63,uVar98);
                    uVar102 = ((short)auVar111._4_2_ < (short)uVar102) * auVar111._4_2_ |
                              ((short)auVar111._4_2_ >= (short)uVar102) * uVar102;
                    uVar71 = ((short)auVar111._6_2_ < (short)uVar71) * auVar111._6_2_ |
                             ((short)auVar111._6_2_ >= (short)uVar71) * uVar71;
                    uVar35 = CONCAT22(uVar71,uVar102);
                    uVar106 = ((short)auVar111._8_2_ < (short)uVar106) * auVar111._8_2_ |
                              ((short)auVar111._8_2_ >= (short)uVar106) * uVar106;
                    uVar72 = ((short)auVar111._10_2_ < (short)uVar72) * auVar111._10_2_ |
                             ((short)auVar111._10_2_ >= (short)uVar72) * uVar72;
                    uVar36 = CONCAT22(uVar72,uVar106);
                    uVar109 = ((short)auVar111._12_2_ < (short)uVar109) * auVar111._12_2_ |
                              ((short)auVar111._12_2_ >= (short)uVar109) * uVar109;
                    uVar73 = ((short)auVar111._14_2_ < (short)uVar73) * auVar111._14_2_ |
                             ((short)auVar111._14_2_ >= (short)uVar73) * uVar73;
                    uVar37 = CONCAT22(uVar73,uVar109);
                    auVar83._0_2_ =
                         (ushort)(sVar12 < sVar113) * sVar113 | (ushort)(sVar12 >= sVar113) * sVar12
                    ;
                    auVar83._2_2_ =
                         (ushort)(sVar15 < sVar118) * sVar118 | (ushort)(sVar15 >= sVar118) * sVar15
                    ;
                    auVar83._4_2_ =
                         (ushort)(sVar122 < sVar121) * sVar121 |
                         (ushort)(sVar122 >= sVar121) * sVar122;
                    auVar83._6_2_ =
                         (ushort)(sVar130 < sVar124) * sVar124 |
                         (ushort)(sVar130 >= sVar124) * sVar130;
                    auVar83._8_2_ =
                         (ushort)(sVar18 < sVar125) * sVar125 | (ushort)(sVar18 >= sVar125) * sVar18
                    ;
                    auVar83._10_2_ =
                         (ushort)(sVar21 < sVar127) * sVar127 | (ushort)(sVar21 >= sVar127) * sVar21
                    ;
                    auVar83._12_2_ =
                         (ushort)(sVar24 < sVar129) * sVar129 | (ushort)(sVar24 >= sVar129) * sVar24
                    ;
                    auVar83._14_2_ =
                         (ushort)(sVar27 < sVar131) * sVar131 | (ushort)(sVar27 >= sVar131) * sVar27
                    ;
                    auVar69 = *(undefined1 (*) [16])((long)*ptr + lVar57);
                    lVar57 = lVar57 + 0x10;
                    uVar47 = uVar47 + 1;
                  } while (lVar58 != lVar57);
                  auVar132 = auVar83;
                  uVar38 = 0;
                  do {
                    uVar47 = (ulong)(uint)(ptr_03[uVar1] - open);
                    if (ptr_03[uVar1] - open < -0x7fff) {
                      uVar47 = 0xffff8000;
                    }
                    uVar67 = ptr[a - 1U][0];
                    auVar115._8_8_ = ptr[a - 1U][1] << 0x10 | uVar67 >> 0x30;
                    auVar115._0_8_ = uVar67 << 0x10 | (ulong)(ushort)ptr_03[uVar56];
                    uVar67 = auVar70._0_8_;
                    auVar70._8_8_ = auVar70._8_8_ << 0x10 | uVar67 >> 0x30;
                    auVar70._0_8_ = uVar67 << 0x10 | uVar47 & 0xffff;
                    auVar82._8_8_ = auVar83._8_8_ << 0x10 | auVar83._0_8_ >> 0x30;
                    auVar82._0_8_ = auVar83._0_8_ << 0x10 | uVar47 & 0xffff;
                    uVar67 = auVar133._0_8_;
                    auVar133._8_8_ = auVar133._8_8_ << 0x10 | uVar67 >> 0x30;
                    local_104 = (ushort)uVar50;
                    auVar133._0_8_ = uVar67 << 0x10 | (ulong)local_104;
                    uVar67 = auVar132._0_8_;
                    auVar132._8_8_ = auVar132._8_8_ << 0x10 | uVar67 >> 0x30;
                    auVar132._0_8_ = uVar67 << 0x10 | uVar47 & 0xffff;
                    bVar62 = true;
                    uVar47 = 1;
                    lVar57 = 0;
                    do {
                      psVar4 = (short *)((long)*local_100 + lVar57);
                      sVar114 = *psVar4;
                      sVar119 = psVar4[1];
                      sVar122 = psVar4[2];
                      sVar121 = psVar4[3];
                      sVar126 = psVar4[4];
                      sVar128 = psVar4[5];
                      sVar130 = psVar4[6];
                      sVar124 = psVar4[7];
                      sVar10 = auVar82._0_2_;
                      auVar134._0_2_ =
                           (ushort)(sVar114 < sVar10) * sVar10 |
                           (ushort)(sVar114 >= sVar10) * sVar114;
                      sVar11 = auVar82._2_2_;
                      auVar134._2_2_ =
                           (ushort)(sVar119 < sVar11) * sVar11 |
                           (ushort)(sVar119 >= sVar11) * sVar119;
                      sVar12 = auVar82._4_2_;
                      auVar134._4_2_ =
                           (ushort)(sVar122 < sVar12) * sVar12 |
                           (ushort)(sVar122 >= sVar12) * sVar122;
                      sVar113 = auVar82._6_2_;
                      auVar134._6_2_ =
                           (ushort)(sVar121 < sVar113) * sVar113 |
                           (ushort)(sVar121 >= sVar113) * sVar121;
                      sVar13 = auVar82._8_2_;
                      auVar134._8_2_ =
                           (ushort)(sVar126 < sVar13) * sVar13 |
                           (ushort)(sVar126 >= sVar13) * sVar126;
                      sVar14 = auVar82._10_2_;
                      auVar134._10_2_ =
                           (ushort)(sVar128 < sVar14) * sVar14 |
                           (ushort)(sVar128 >= sVar14) * sVar128;
                      sVar15 = auVar82._12_2_;
                      auVar134._12_2_ =
                           (ushort)(sVar130 < sVar15) * sVar15 |
                           (ushort)(sVar130 >= sVar15) * sVar130;
                      sVar118 = auVar82._14_2_;
                      auVar134._14_2_ =
                           (ushort)(sVar124 < sVar118) * sVar118 |
                           (ushort)(sVar124 >= sVar118) * sVar124;
                      *(undefined1 (*) [16])((long)*local_100 + lVar57) = auVar134;
                      auVar69 = paddsw(auVar115,*(undefined1 (*) [16])
                                                 ((long)pvVar7 + lVar57 + lVar51 * 0x10));
                      uVar112 = -(ushort)(sVar10 < sVar114 || auVar69._0_2_ == auVar134._0_2_);
                      uVar117 = -(ushort)(sVar11 < sVar119 || auVar69._2_2_ == auVar134._2_2_);
                      uVar120 = -(ushort)(sVar12 < sVar122 || auVar69._4_2_ == auVar134._4_2_);
                      uVar123 = -(ushort)(sVar113 < sVar121 || auVar69._6_2_ == auVar134._6_2_);
                      uVar84 = -(ushort)(sVar13 < sVar126 || auVar69._8_2_ == auVar134._8_2_);
                      uVar85 = -(ushort)(sVar14 < sVar128 || auVar69._10_2_ == auVar134._10_2_);
                      uVar86 = -(ushort)(sVar15 < sVar130 || auVar69._12_2_ == auVar134._12_2_);
                      uVar87 = -(ushort)(sVar118 < sVar124 || auVar69._14_2_ == auVar134._14_2_);
                      puVar3 = (ushort *)
                               ((long)((ppVar44->field_4).rowcols)->score_row + lVar57 + lVar54);
                      uVar75 = *puVar3;
                      uVar74 = puVar3[1];
                      uVar76 = puVar3[2];
                      uVar77 = puVar3[3];
                      uVar78 = puVar3[4];
                      uVar79 = puVar3[5];
                      uVar81 = puVar3[6];
                      uVar80 = puVar3[7];
                      puVar3 = (ushort *)((long)*ptr_02 + lVar57);
                      uVar112 = ~uVar112 & 2 | *puVar3 & uVar112;
                      uVar117 = ~uVar117 & 2 | puVar3[1] & uVar117;
                      uVar120 = ~uVar120 & 2 | puVar3[2] & uVar120;
                      uVar123 = ~uVar123 & 2 | puVar3[3] & uVar123;
                      uVar84 = ~uVar84 & 2 | puVar3[4] & uVar84;
                      uVar85 = ~uVar85 & 2 | puVar3[5] & uVar85;
                      uVar86 = ~uVar86 & 2 | puVar3[6] & uVar86;
                      uVar87 = ~uVar87 & 2 | puVar3[7] & uVar87;
                      puVar3 = (ushort *)((long)*ptr_02 + lVar57);
                      *puVar3 = uVar112;
                      puVar3[1] = uVar117;
                      puVar3[2] = uVar120;
                      puVar3[3] = uVar123;
                      puVar3[4] = uVar84;
                      puVar3[5] = uVar85;
                      puVar3[6] = uVar86;
                      puVar3[7] = uVar87;
                      puVar3 = (ushort *)
                               ((long)((ppVar44->field_4).rowcols)->score_row + lVar57 + lVar54);
                      *puVar3 = uVar112 | uVar75 & 0x78;
                      puVar3[1] = uVar117 | uVar74 & 0x78;
                      puVar3[2] = uVar120 | uVar76 & 0x78;
                      puVar3[3] = uVar123 | uVar77 & 0x78;
                      puVar3[4] = uVar84 | uVar78 & 0x78;
                      puVar3[5] = uVar85 | uVar79 & 0x78;
                      puVar3[6] = uVar86 | uVar81 & 0x78;
                      puVar3[7] = uVar87 | uVar80 & 0x78;
                      piVar9 = ((ppVar44->field_4).rowcols)->score_row;
                      puVar3 = (ushort *)((long)piVar9 + lVar57 + lVar54);
                      uVar75 = puVar3[1];
                      uVar74 = puVar3[2];
                      uVar76 = puVar3[3];
                      uVar77 = puVar3[4];
                      uVar78 = puVar3[5];
                      uVar79 = puVar3[6];
                      uVar81 = puVar3[7];
                      puVar5 = (ushort *)((long)piVar9 + lVar57 + lVar54);
                      *puVar5 = (*puVar3 & 0x1f | -(ushort)(auVar133._0_2_ < auVar70._0_2_) & 0x60)
                                ^ 0x40;
                      puVar5[1] = (uVar75 & 0x1f | -(ushort)(auVar133._2_2_ < auVar70._2_2_) & 0x60)
                                  ^ 0x40;
                      puVar5[2] = (uVar74 & 0x1f | -(ushort)(auVar133._4_2_ < auVar70._4_2_) & 0x60)
                                  ^ 0x40;
                      puVar5[3] = (uVar76 & 0x1f | -(ushort)(auVar133._6_2_ < auVar70._6_2_) & 0x60)
                                  ^ 0x40;
                      puVar5[4] = (uVar77 & 0x1f | -(ushort)(auVar133._8_2_ < auVar70._8_2_) & 0x60)
                                  ^ 0x40;
                      puVar5[5] = (uVar78 & 0x1f |
                                  -(ushort)(auVar133._10_2_ < auVar70._10_2_) & 0x60) ^ 0x40;
                      puVar5[6] = (uVar79 & 0x1f |
                                  -(ushort)(auVar133._12_2_ < auVar70._12_2_) & 0x60) ^ 0x40;
                      puVar5[7] = (uVar81 & 0x1f |
                                  -(ushort)(auVar133._14_2_ < auVar70._14_2_) & 0x60) ^ 0x40;
                      auVar29._4_4_ = uVar64;
                      auVar29._0_4_ = uVar64;
                      auVar29._8_4_ = uVar64;
                      auVar29._12_4_ = uVar64;
                      auVar70 = psubsw(auVar134,auVar29);
                      auVar32._4_4_ = uVar65;
                      auVar32._0_4_ = uVar65;
                      auVar32._8_4_ = uVar65;
                      auVar32._12_4_ = uVar65;
                      auVar69 = psubsw(*(undefined1 (*) [16])((long)*ptr_01 + lVar57),auVar32);
                      sVar10 = auVar69._0_2_;
                      sVar114 = auVar70._0_2_;
                      sVar11 = auVar69._2_2_;
                      sVar119 = auVar70._2_2_;
                      sVar12 = auVar69._4_2_;
                      sVar122 = auVar70._4_2_;
                      sVar113 = auVar69._6_2_;
                      sVar121 = auVar70._6_2_;
                      sVar13 = auVar69._8_2_;
                      sVar126 = auVar70._8_2_;
                      sVar14 = auVar69._10_2_;
                      sVar128 = auVar70._10_2_;
                      sVar15 = auVar69._12_2_;
                      sVar130 = auVar70._12_2_;
                      sVar124 = auVar70._14_2_;
                      sVar118 = auVar69._14_2_;
                      puVar3 = (ushort *)((long)*local_d0 + lVar57);
                      *puVar3 = (ushort)(sVar114 < sVar10) * sVar10 |
                                (ushort)(sVar114 >= sVar10) * sVar114;
                      puVar3[1] = (ushort)(sVar119 < sVar11) * sVar11 |
                                  (ushort)(sVar119 >= sVar11) * sVar119;
                      puVar3[2] = (ushort)(sVar122 < sVar12) * sVar12 |
                                  (ushort)(sVar122 >= sVar12) * sVar122;
                      puVar3[3] = (ushort)(sVar121 < sVar113) * sVar113 |
                                  (ushort)(sVar121 >= sVar113) * sVar121;
                      puVar3[4] = (ushort)(sVar126 < sVar13) * sVar13 |
                                  (ushort)(sVar126 >= sVar13) * sVar126;
                      puVar3[5] = (ushort)(sVar128 < sVar14) * sVar14 |
                                  (ushort)(sVar128 >= sVar14) * sVar128;
                      puVar3[6] = (ushort)(sVar130 < sVar15) * sVar15 |
                                  (ushort)(sVar130 >= sVar15) * sVar130;
                      puVar3[7] = (ushort)(sVar124 < sVar118) * sVar118 |
                                  (ushort)(sVar124 >= sVar118) * sVar124;
                      if (uVar1 < uVar59) {
                        puVar3 = (ushort *)
                                 ((long)((ppVar44->field_4).rowcols)->score_row + lVar57 + local_110
                                 );
                        *puVar3 = -(ushort)(sVar10 < sVar114) & 0x18 ^ 0x10;
                        puVar3[1] = -(ushort)(sVar11 < sVar119) & 0x18 ^ 0x10;
                        puVar3[2] = -(ushort)(sVar12 < sVar122) & 0x18 ^ 0x10;
                        puVar3[3] = -(ushort)(sVar113 < sVar121) & 0x18 ^ 0x10;
                        puVar3[4] = -(ushort)(sVar13 < sVar126) & 0x18 ^ 0x10;
                        puVar3[5] = -(ushort)(sVar14 < sVar128) & 0x18 ^ 0x10;
                        puVar3[6] = -(ushort)(sVar15 < sVar130) & 0x18 ^ 0x10;
                        puVar3[7] = -(ushort)(sVar118 < sVar124) & 0x18 ^ 0x10;
                      }
                      uVar98 = ((short)auVar134._0_2_ < (short)uVar98) * auVar134._0_2_ |
                               ((short)auVar134._0_2_ >= (short)uVar98) * uVar98;
                      uVar63 = ((short)auVar134._2_2_ < (short)uVar63) * auVar134._2_2_ |
                               ((short)auVar134._2_2_ >= (short)uVar63) * uVar63;
                      uVar66 = CONCAT22(uVar63,uVar98);
                      uVar102 = ((short)auVar134._4_2_ < (short)uVar102) * auVar134._4_2_ |
                                ((short)auVar134._4_2_ >= (short)uVar102) * uVar102;
                      uVar71 = ((short)auVar134._6_2_ < (short)uVar71) * auVar134._6_2_ |
                               ((short)auVar134._6_2_ >= (short)uVar71) * uVar71;
                      uVar35 = CONCAT22(uVar71,uVar102);
                      uVar106 = ((short)auVar134._8_2_ < (short)uVar106) * auVar134._8_2_ |
                                ((short)auVar134._8_2_ >= (short)uVar106) * uVar106;
                      uVar72 = ((short)auVar134._10_2_ < (short)uVar72) * auVar134._10_2_ |
                               ((short)auVar134._10_2_ >= (short)uVar72) * uVar72;
                      uVar36 = CONCAT22(uVar72,uVar106);
                      uVar109 = ((short)auVar134._12_2_ < (short)uVar109) * auVar134._12_2_ |
                                ((short)auVar134._12_2_ >= (short)uVar109) * uVar109;
                      uVar73 = ((short)auVar134._14_2_ < (short)uVar73) * auVar134._14_2_ |
                               ((short)auVar134._14_2_ >= (short)uVar73) * uVar73;
                      uVar37 = CONCAT22(uVar73,uVar109);
                      uVar88 = ((short)uVar88 < (short)auVar134._0_2_) * auVar134._0_2_ |
                               ((short)uVar88 >= (short)auVar134._0_2_) * uVar88;
                      uVar90 = ((short)uVar90 < (short)auVar134._2_2_) * auVar134._2_2_ |
                               ((short)uVar90 >= (short)auVar134._2_2_) * uVar90;
                      uVar91 = ((short)uVar91 < (short)auVar134._4_2_) * auVar134._4_2_ |
                               ((short)uVar91 >= (short)auVar134._4_2_) * uVar91;
                      uVar92 = ((short)uVar92 < (short)auVar134._6_2_) * auVar134._6_2_ |
                               ((short)uVar92 >= (short)auVar134._6_2_) * uVar92;
                      uVar93 = ((short)uVar93 < (short)auVar134._8_2_) * auVar134._8_2_ |
                               ((short)uVar93 >= (short)auVar134._8_2_) * uVar93;
                      uVar94 = ((short)uVar94 < (short)auVar134._10_2_) * auVar134._10_2_ |
                               ((short)uVar94 >= (short)auVar134._10_2_) * uVar94;
                      uVar95 = ((short)uVar95 < (short)auVar134._12_2_) * auVar134._12_2_ |
                               ((short)uVar95 >= (short)auVar134._12_2_) * uVar95;
                      uVar96 = ((short)uVar96 < (short)auVar134._14_2_) * auVar134._14_2_ |
                               ((short)uVar96 >= (short)auVar134._14_2_) * uVar96;
                      auVar33._4_4_ = uVar65;
                      auVar33._0_4_ = uVar65;
                      auVar33._8_4_ = uVar65;
                      auVar33._12_4_ = uVar65;
                      auVar69 = psubsw(auVar82,auVar33);
                      auVar116._0_2_ = -(ushort)(auVar69._0_2_ < sVar114);
                      auVar116._2_2_ = -(ushort)(auVar69._2_2_ < sVar119);
                      auVar116._4_2_ = -(ushort)(auVar69._4_2_ < sVar122);
                      auVar116._6_2_ = -(ushort)(auVar69._6_2_ < sVar121);
                      auVar116._8_2_ = -(ushort)(auVar69._8_2_ < sVar126);
                      auVar116._10_2_ = -(ushort)(auVar69._10_2_ < sVar128);
                      auVar116._12_2_ = -(ushort)(auVar69._12_2_ < sVar130);
                      auVar116._14_2_ = -(ushort)(auVar69._14_2_ < sVar124);
                      auVar83 = auVar82;
                      if ((ushort)((ushort)(SUB161(auVar116 >> 7,0) & 1) |
                                   (ushort)(SUB161(auVar116 >> 0xf,0) & 1) << 1 |
                                   (ushort)(SUB161(auVar116 >> 0x17,0) & 1) << 2 |
                                   (ushort)(SUB161(auVar116 >> 0x1f,0) & 1) << 3 |
                                   (ushort)(SUB161(auVar116 >> 0x27,0) & 1) << 4 |
                                   (ushort)(SUB161(auVar116 >> 0x2f,0) & 1) << 5 |
                                   (ushort)(SUB161(auVar116 >> 0x37,0) & 1) << 6 |
                                   (ushort)(SUB161(auVar116 >> 0x3f,0) & 1) << 7 |
                                   (ushort)(SUB161(auVar116 >> 0x47,0) & 1) << 8 |
                                   (ushort)(SUB161(auVar116 >> 0x4f,0) & 1) << 9 |
                                   (ushort)(SUB161(auVar116 >> 0x57,0) & 1) << 10 |
                                   (ushort)(SUB161(auVar116 >> 0x5f,0) & 1) << 0xb |
                                   (ushort)(SUB161(auVar116 >> 0x67,0) & 1) << 0xc |
                                   (ushort)(SUB161(auVar116 >> 0x6f,0) & 1) << 0xd |
                                   (ushort)((byte)(auVar116._14_2_ >> 7) & 1) << 0xe |
                                  auVar116._14_2_ & 0x8000) == 0xffff) break;
                      auVar34._4_4_ = uVar65;
                      auVar34._0_4_ = uVar65;
                      auVar34._8_4_ = uVar65;
                      auVar34._12_4_ = uVar65;
                      auVar133 = psubsw(auVar132,auVar34);
                      sVar10 = auVar133._0_2_;
                      auVar132._0_2_ =
                           (ushort)(sVar114 < sVar10) * sVar10 |
                           (ushort)(sVar114 >= sVar10) * sVar114;
                      sVar10 = auVar133._2_2_;
                      auVar132._2_2_ =
                           (ushort)(sVar119 < sVar10) * sVar10 |
                           (ushort)(sVar119 >= sVar10) * sVar119;
                      sVar10 = auVar133._4_2_;
                      auVar132._4_2_ =
                           (ushort)(sVar122 < sVar10) * sVar10 |
                           (ushort)(sVar122 >= sVar10) * sVar122;
                      sVar10 = auVar133._6_2_;
                      auVar132._6_2_ =
                           (ushort)(sVar121 < sVar10) * sVar10 |
                           (ushort)(sVar121 >= sVar10) * sVar121;
                      sVar10 = auVar133._8_2_;
                      auVar132._8_2_ =
                           (ushort)(sVar126 < sVar10) * sVar10 |
                           (ushort)(sVar126 >= sVar10) * sVar126;
                      sVar10 = auVar133._10_2_;
                      auVar132._10_2_ =
                           (ushort)(sVar128 < sVar10) * sVar10 |
                           (ushort)(sVar128 >= sVar10) * sVar128;
                      sVar10 = auVar133._12_2_;
                      auVar132._12_2_ =
                           (ushort)(sVar130 < sVar10) * sVar10 |
                           (ushort)(sVar130 >= sVar10) * sVar130;
                      sVar10 = auVar133._14_2_;
                      auVar132._14_2_ =
                           (ushort)(sVar124 < sVar10) * sVar10 |
                           (ushort)(sVar124 >= sVar10) * sVar124;
                      auVar115 = *(undefined1 (*) [16])((long)*ptr + lVar57);
                      bVar62 = uVar47 < uVar61;
                      lVar57 = lVar57 + 0x10;
                      uVar47 = uVar47 + 1;
                      auVar83 = auVar69;
                      auVar82 = auVar69;
                    } while (lVar58 != lVar57);
                  } while ((!bVar62) && (bVar62 = uVar38 < 7, uVar38 = uVar38 + 1, bVar62));
                  local_110 = local_110 + lVar60;
                  lVar54 = lVar54 + lVar60;
                  palVar46 = local_d0;
                  uVar56 = uVar1;
                  palVar45 = local_100;
                  if (uVar1 == uVar55) {
                    uVar59 = local_100[(uint)(iVar40 % a)][0];
                    uVar61 = local_100[(uint)(iVar40 % a)][1];
                    if (iVar40 / a < 7) {
                      iVar43 = 1;
                      if (1 < iVar42) {
                        iVar43 = iVar42;
                      }
                      do {
                        uVar61 = uVar61 << 0x10 | uVar59 >> 0x30;
                        iVar43 = iVar43 + -1;
                        uVar59 = uVar59 << 0x10;
                      } while (iVar43 != 0);
                    }
                    auVar68._0_2_ = -(ushort)((short)uVar98 < (short)local_88);
                    auVar68._2_2_ = -(ushort)((short)uVar63 < (short)uStack_86);
                    auVar68._4_2_ = -(ushort)((short)uVar102 < (short)local_88);
                    auVar68._6_2_ = -(ushort)((short)uVar71 < (short)uStack_86);
                    auVar68._8_2_ = -(ushort)((short)uVar106 < (short)local_88);
                    auVar68._10_2_ = -(ushort)((short)uVar72 < (short)uStack_86);
                    auVar68._12_2_ = -(ushort)((short)uVar109 < (short)local_88);
                    auVar68._14_2_ = -(ushort)((short)uVar73 < (short)uStack_86);
                    auVar89._0_2_ = -(ushort)(sVar100 < (short)uVar88);
                    auVar89._2_2_ = -(ushort)(sVar103 < (short)uVar90);
                    auVar89._4_2_ = -(ushort)(sVar100 < (short)uVar91);
                    auVar89._6_2_ = -(ushort)(sVar103 < (short)uVar92);
                    auVar89._8_2_ = -(ushort)(sVar100 < (short)uVar93);
                    auVar89._10_2_ = -(ushort)(sVar103 < (short)uVar94);
                    auVar89._12_2_ = -(ushort)(sVar100 < (short)uVar95);
                    auVar89._14_2_ = -(ushort)(sVar103 < (short)uVar96);
                    auVar89 = auVar89 | auVar68;
                    if ((((((((((((((((auVar89 >> 7 & (undefined1  [16])0x1) ==
                                      (undefined1  [16])0x0 &&
                                     (auVar89 >> 0xf & (undefined1  [16])0x1) ==
                                     (undefined1  [16])0x0) &&
                                    (auVar89 >> 0x17 & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                                   (auVar89 >> 0x1f & (undefined1  [16])0x1) ==
                                   (undefined1  [16])0x0) &&
                                  (auVar89 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0
                                  ) && (auVar89 >> 0x2f & (undefined1  [16])0x1) ==
                                       (undefined1  [16])0x0) &&
                                (auVar89 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                               && (auVar89 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0
                               ) && (auVar89 >> 0x47 & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                             (auVar89 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            (auVar89 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar89 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar89 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar89 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar89 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        -1 < auVar89[0xf]) {
                      sVar100 = (short)(uVar61 >> 0x30);
                    }
                    else {
                      *(byte *)&ppVar44->flag = (byte)ppVar44->flag | 0x40;
                      sVar100 = 0;
                      iVar41 = 0;
                      iVar40 = 0;
                    }
                    ppVar44->score = (int)sVar100;
                    ppVar44->end_query = iVar40;
                    ppVar44->end_ref = iVar41;
                    parasail_free(ptr_03);
                    parasail_free(ptr_02);
                    parasail_free(ptr_01);
                    parasail_free(local_d0);
                    parasail_free(ptr_00);
                    parasail_free(ptr);
                    parasail_free(local_100);
                    return ppVar44;
                  }
                } while( true );
              }
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict vProfile = NULL;
    __m128i* restrict pvHStore = NULL;
    __m128i* restrict pvHLoad = NULL;
    __m128i* restrict pvE = NULL;
    __m128i* restrict pvEaStore = NULL;
    __m128i* restrict pvEaLoad = NULL;
    __m128i* restrict pvHT = NULL;
    int16_t* restrict boundary = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int16_t NEG_LIMIT = 0;
    int16_t POS_LIMIT = 0;
    int16_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    parasail_result_t *result = NULL;
    __m128i vTIns;
    __m128i vTDel;
    __m128i vTDiag;
    __m128i vTDiagE;
    __m128i vTInsE;
    __m128i vTDiagF;
    __m128i vTDelF;
    __m128i vTMask;
    __m128i vFTMask;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile16.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 8; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    vProfile = (__m128i*)profile->profile16.score;
    vGapO = _mm_set1_epi16(open);
    vGapE = _mm_set1_epi16(gap);
    NEG_LIMIT = (-open < matrix->min ? INT16_MIN + open : INT16_MIN - matrix->min) + 1;
    POS_LIMIT = INT16_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi16(NEG_LIMIT);
    vPosLimit = _mm_set1_epi16(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vTIns  = _mm_set1_epi16(PARASAIL_INS);
    vTDel  = _mm_set1_epi16(PARASAIL_DEL);
    vTDiag = _mm_set1_epi16(PARASAIL_DIAG);
    vTDiagE = _mm_set1_epi16(PARASAIL_DIAG_E);
    vTInsE = _mm_set1_epi16(PARASAIL_INS_E);
    vTDiagF = _mm_set1_epi16(PARASAIL_DIAG_F);
    vTDelF = _mm_set1_epi16(PARASAIL_DEL_F);
    vTMask = _mm_set1_epi16(PARASAIL_ZERO_MASK);
    vFTMask = _mm_set1_epi16(PARASAIL_F_MASK);

    /* initialize result */
    result = parasail_result_new_trace(segLen, s2Len, 16, sizeof(__m128i));
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_TRACE
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_8;

    /* initialize heap variables */
    pvHStore = parasail_memalign___m128i(16, segLen);
    pvHLoad = parasail_memalign___m128i(16, segLen);
    pvE = parasail_memalign___m128i(16, segLen);
    pvEaStore = parasail_memalign___m128i(16, segLen);
    pvEaLoad = parasail_memalign___m128i(16, segLen);
    pvHT = parasail_memalign___m128i(16, segLen);
    boundary = parasail_memalign_int16_t(16, s2Len+1);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvE) return NULL;
    if (!pvEaStore) return NULL;
    if (!pvEaLoad) return NULL;
    if (!pvHT) return NULL;
    if (!boundary) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_16_t h;
            __m128i_16_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = -open-gap*(segNum*segLen+i);
                h.v[segNum] = tmp < INT16_MIN ? INT16_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT16_MIN ? INT16_MIN : tmp;
            }
            _mm_store_si128(&pvHStore[index], h.m);
            _mm_store_si128(&pvE[index], e.m);
            _mm_store_si128(&pvEaStore[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = -open-gap*(i-1);
            boundary[i] = tmp < INT16_MIN ? INT16_MIN : tmp;
        }
    }

    for (i=0; i<segLen; ++i) {
        arr_store(result->trace->trace_table, vTDiagE, i, segLen, 0);
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vEF_opn;
        __m128i vE;
        __m128i vE_ext;
        __m128i vF;
        __m128i vF_ext;
        __m128i vFa;
        __m128i vFa_ext;
        __m128i vH;
        __m128i vH_dag;
        const __m128i* vP = NULL;

        /* Initialize F value to -inf.  Any errors to vH values will be
         * corrected in the Lazy_F loop.  */
        vF = vNegLimit;

        /* load final segment of pvHStore and shift left by 2 bytes */
        vH = _mm_load_si128(&pvHStore[segLen - 1]);
        vH = _mm_slli_si128(vH, 2);

        /* insert upper boundary condition */
        vH = _mm_insert_epi16(vH, boundary[j], 0);

        /* Correct part of the vProfile */
        vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;

        /* Swap the 2 H buffers. */
        SWAP(pvHLoad, pvHStore)
        SWAP(pvEaLoad, pvEaStore)

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            vE = _mm_load_si128(pvE + i);

            /* Get max from vH, vE and vF. */
            vH_dag = _mm_adds_epi16(vH, _mm_load_si128(vP + i));
            vH = _mm_max_epi16(vH_dag, vE);
            vH = _mm_max_epi16(vH, vF);
            /* Save vH values. */
            _mm_store_si128(pvHStore + i, vH);
            vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vH);
            vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vH);
            vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vE);
            vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vF);

            {
                __m128i vTAll = arr_load(result->trace->trace_table, i, segLen, j);
                __m128i case1 = _mm_cmpeq_epi16(vH, vH_dag);
                __m128i case2 = _mm_cmpeq_epi16(vH, vF);
                __m128i vT = _mm_blendv_epi8_rpl(
                        _mm_blendv_epi8_rpl(vTIns, vTDel, case2),
                        vTDiag, case1);
                _mm_store_si128(pvHT + i, vT);
                vT = _mm_or_si128(vT, vTAll);
                arr_store(result->trace->trace_table, vT, i, segLen, j);
            }

            vEF_opn = _mm_subs_epi16(vH, vGapO);

            /* Update vE value. */
            vE_ext = _mm_subs_epi16(vE, vGapE);
            vE = _mm_max_epi16(vEF_opn, vE_ext);
            _mm_store_si128(pvE + i, vE);
            {
                __m128i vEa = _mm_load_si128(pvEaLoad + i);
                __m128i vEa_ext = _mm_subs_epi16(vEa, vGapE);
                vEa = _mm_max_epi16(vEF_opn, vEa_ext);
                _mm_store_si128(pvEaStore + i, vEa);
                if (j+1<s2Len) {
                    __m128i cond = _mm_cmpgt_epi16(vEF_opn, vEa_ext);
                    __m128i vT = _mm_blendv_epi8_rpl(vTInsE, vTDiagE, cond);
                    arr_store(result->trace->trace_table, vT, i, segLen, j+1);
                }
            }

            /* Update vF value. */
            vF_ext = _mm_subs_epi16(vF, vGapE);
            vF = _mm_max_epi16(vEF_opn, vF_ext);
            if (i+1<segLen) {
                __m128i vTAll = arr_load(result->trace->trace_table, i+1, segLen, j);
                __m128i cond = _mm_cmpgt_epi16(vEF_opn, vF_ext);
                __m128i vT = _mm_blendv_epi8_rpl(vTDelF, vTDiagF, cond);
                vT = _mm_or_si128(vT, vTAll);
                arr_store(result->trace->trace_table, vT, i+1, segLen, j);
            }

            /* Load the next vH. */
            vH = _mm_load_si128(pvHLoad + i);
        }


        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        vFa_ext = vF_ext;
        vFa = vF;
        for (k=0; k<segWidth; ++k) {
            int64_t tmp = boundary[j+1]-open;
            int16_t tmp2 = tmp < INT16_MIN ? INT16_MIN : tmp;
            __m128i vHp = _mm_load_si128(&pvHLoad[segLen - 1]);
            vHp = _mm_slli_si128(vHp, 2);
            vHp = _mm_insert_epi16(vHp, boundary[j], 0);
            vEF_opn = _mm_slli_si128(vEF_opn, 2);
            vEF_opn = _mm_insert_epi16(vEF_opn, tmp2, 0);
            vF_ext = _mm_slli_si128(vF_ext, 2);
            vF_ext = _mm_insert_epi16(vF_ext, NEG_LIMIT, 0);
            vF = _mm_slli_si128(vF, 2);
            vF = _mm_insert_epi16(vF, tmp2, 0);
            vFa_ext = _mm_slli_si128(vFa_ext, 2);
            vFa_ext = _mm_insert_epi16(vFa_ext, NEG_LIMIT, 0);
            vFa = _mm_slli_si128(vFa, 2);
            vFa = _mm_insert_epi16(vFa, tmp2, 0);
            for (i=0; i<segLen; ++i) {
                vH = _mm_load_si128(pvHStore + i);
                vH = _mm_max_epi16(vH,vF);
                _mm_store_si128(pvHStore + i, vH);
                vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vH);
                vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vH);
                {
                    __m128i vTAll;
                    __m128i vT;
                    __m128i case1;
                    __m128i case2;
                    __m128i cond;
                    vHp = _mm_adds_epi16(vHp, _mm_load_si128(vP + i));
                    case1 = _mm_cmpeq_epi16(vH, vHp);
                    case2 = _mm_cmpeq_epi16(vH, vF);
                    cond = _mm_andnot_si128(case1,case2);
                    vTAll = arr_load(result->trace->trace_table, i, segLen, j);
                    vT = _mm_load_si128(pvHT + i);
                    vT = _mm_blendv_epi8_rpl(vT, vTDel, cond);
                    _mm_store_si128(pvHT + i, vT);
                    vTAll = _mm_and_si128(vTAll, vTMask);
                    vTAll = _mm_or_si128(vTAll, vT);
                    arr_store(result->trace->trace_table, vTAll, i, segLen, j);
                }
                /* Update vF value. */
                {
                    __m128i vTAll = arr_load(result->trace->trace_table, i, segLen, j);
                    __m128i cond = _mm_cmpgt_epi16(vEF_opn, vFa_ext);
                    __m128i vT = _mm_blendv_epi8_rpl(vTDelF, vTDiagF, cond);
                    vTAll = _mm_and_si128(vTAll, vFTMask);
                    vTAll = _mm_or_si128(vTAll, vT);
                    arr_store(result->trace->trace_table, vTAll, i, segLen, j);
                }
                vEF_opn = _mm_subs_epi16(vH, vGapO);
                vF_ext = _mm_subs_epi16(vF, vGapE);
                {
                    __m128i vEa = _mm_load_si128(pvEaLoad + i);
                    __m128i vEa_ext = _mm_subs_epi16(vEa, vGapE);
                    vEa = _mm_max_epi16(vEF_opn, vEa_ext);
                    _mm_store_si128(pvEaStore + i, vEa);
                    if (j+1<s2Len) {
                        __m128i cond = _mm_cmpgt_epi16(vEF_opn, vEa_ext);
                        __m128i vT = _mm_blendv_epi8_rpl(vTInsE, vTDiagE, cond);
                        arr_store(result->trace->trace_table, vT, i, segLen, j+1);
                    }
                }
                if (! _mm_movemask_epi8(
                            _mm_or_si128(
                                _mm_cmpgt_epi16(vF_ext, vEF_opn),
                                _mm_cmpeq_epi16(vF_ext, vEF_opn))))
                    goto end;
                /*vF = _mm_max_epi16(vEF_opn, vF_ext);*/
                vF = vF_ext;
                vFa_ext = _mm_subs_epi16(vFa, vGapE);
                vFa = _mm_max_epi16(vEF_opn, vFa_ext);
                vHp = _mm_load_si128(pvHLoad + i);
            }
        }
end:
        {
        }
    }

    /* extract last value from the last column */
    {
        __m128i vH = _mm_load_si128(pvHStore + offset);
        for (k=0; k<position; ++k) {
            vH = _mm_slli_si128 (vH, 2);
        }
        score = (int16_t) _mm_extract_epi16 (vH, 7);
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi16(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi16(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(boundary);
    parasail_free(pvHT);
    parasail_free(pvEaLoad);
    parasail_free(pvEaStore);
    parasail_free(pvE);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}